

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Sym * find_D_Sym_in_Scope(D_Scope *st,D_Scope *cur,char *name,char *end)

{
  uint h;
  size_t sVar1;
  D_Sym *pDVar2;
  D_Sym *pDVar3;
  int l;
  
  if (end == (char *)0x0) {
    sVar1 = strlen(name);
    l = (int)sVar1;
  }
  else {
    l = (int)end - (int)name;
  }
  h = strhashl(name,l);
  pDVar2 = find_D_Sym_in_Scope_internal(cur,name,l,h);
  if (pDVar2 == (D_Sym *)0x0) {
    pDVar3 = (D_Sym *)0x0;
  }
  else {
    pDVar3 = pDVar2->update_of;
    if (pDVar2->update_of == (D_Sym *)0x0) {
      pDVar3 = pDVar2;
    }
    for (; st != (D_Scope *)0x0; st = st->up_updates) {
      for (pDVar2 = st->updates; pDVar2 != (D_Sym *)0x0; pDVar2 = pDVar2->next) {
        if (pDVar2->update_of == pDVar3) {
          return pDVar2;
        }
      }
    }
  }
  return pDVar3;
}

Assistant:

D_Sym *find_D_Sym_in_Scope(D_Scope *st, D_Scope *cur, char *name, char *end) {
  uint len = end ? end - name : strlen(name);
  uint h = strhashl(name, len);
  D_Sym *s = find_D_Sym_in_Scope_internal(cur, name, len, h);
  if (s) return current_D_Sym(st, s);
  return NULL;
}